

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HBT_correlation.cpp
# Opt level: O3

void __thiscall HBT_correlation::output_correlation_function(HBT_correlation *this)

{
  unsigned_long_long uVar1;
  unsigned_long_long uVar2;
  undefined1 auVar3 [16];
  long lVar4;
  undefined8 uVar5;
  ostream *poVar6;
  int iVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  undefined1 auVar13 [16];
  double dVar14;
  ofstream output;
  ostringstream filename;
  undefined8 local_458;
  undefined8 local_448;
  double local_420;
  undefined1 local_418 [12];
  undefined4 uStack_40c;
  string local_3f8;
  char *local_3d8;
  char local_3c8 [16];
  undefined1 local_3b8 [16];
  long local_3a8;
  filebuf local_3a0 [8];
  undefined8 uStack_398;
  uint auStack_390 [56];
  ios_base local_2b0 [264];
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  uVar5 = _log;
  lVar4 = _VTT;
  if (1 < this->n_KT) {
    lVar12 = 0;
    do {
      uVar1 = (this->number_of_pairs_numerator_KTdiff).
              super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
              super__Vector_impl_data._M_start[lVar12];
      uVar2 = (this->number_of_pairs_denormenator_KTdiff).
              super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
              super__Vector_impl_data._M_start[lVar12];
      std::__cxx11::ostringstream::ostringstream(local_1a8);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1a8,(this->path_)._M_dataplus._M_p,
                          (this->path_)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar6,"/HBT_correlation_function_KT_",0x1d);
      poVar6 = std::ostream::_M_insert<double>
                         ((this->KT_array_).super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_start[lVar12]);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"_",1);
      poVar6 = std::ostream::_M_insert<double>
                         ((this->KT_array_).super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_start[lVar12 + 1]);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,".dat",4);
      std::__cxx11::stringbuf::str();
      std::ofstream::ofstream(&local_3a8,local_3d8,_S_out);
      if (local_3d8 != local_3c8) {
        operator_delete(local_3d8);
      }
      iVar7 = this->qnpts;
      if (0 < iVar7) {
        local_448._0_4_ = (undefined4)uVar1;
        local_448._4_4_ = (undefined4)(uVar1 >> 0x20);
        dVar14 = (double)CONCAT44(0x45300000,local_448._4_4_) - 1.9342813113834067e+25;
        local_458._0_4_ = (undefined4)uVar2;
        local_458._4_4_ = (undefined4)(uVar2 >> 0x20);
        local_3b8._0_8_ =
             (dVar14 + ((double)CONCAT44(0x43300000,(undefined4)local_448) - 4503599627370496.0)) /
             (((double)CONCAT44(0x45300000,local_458._4_4_) - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(undefined4)local_458) - 4503599627370496.0));
        local_3b8._8_8_ = dVar14;
        lVar11 = 0;
        do {
          if (0 < iVar7) {
            lVar10 = 0;
            do {
              if (iVar7 < 1) {
                lVar8 = (long)iVar7;
              }
              else {
                lVar9 = 0;
                do {
                  iVar7 = (int)this->correl_3d_denorm[lVar12][lVar10][lVar9][lVar11];
                  if (((int)this->correl_3d_num_count[lVar12][lVar10][lVar9][lVar11] < 2) ||
                     (iVar7 < 2)) {
                    local_420 = (this->q_long).super__Vector_base<double,_std::allocator<double>_>.
                                _M_impl.super__Vector_impl_data._M_start[lVar11];
                    local_458 = (double)iVar7;
                    dVar14 = (this->q_side).super__Vector_base<double,_std::allocator<double>_>.
                             _M_impl.super__Vector_impl_data._M_start[lVar9];
                    local_418._8_4_ = SUB84(dVar14,0);
                    local_418._0_8_ =
                         (this->q_out).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start[lVar10];
                    uStack_40c = (int)((ulong)dVar14 >> 0x20);
                    local_448 = 0.0;
                  }
                  else {
                    dVar14 = (double)(int)this->correl_3d_num_count[lVar12][lVar10][lVar9][lVar11];
                    auVar13._8_8_ = this->q_side_mean[lVar12][lVar10][lVar9][lVar11];
                    auVar13._0_8_ = this->q_out_mean[lVar12][lVar10][lVar9][lVar11];
                    local_420 = this->q_long_mean[lVar12][lVar10][lVar9][lVar11] / dVar14;
                    auVar3._8_4_ = SUB84(dVar14,0);
                    auVar3._0_8_ = dVar14;
                    auVar3._12_4_ = (int)((ulong)dVar14 >> 0x20);
                    _local_418 = divpd(auVar13,auVar3);
                    local_448 = this->correl_3d_num[lVar12][lVar10][lVar9][lVar11];
                    local_458 = this->correl_3d_denorm[lVar12][lVar10][lVar9][lVar11] *
                                (double)local_3b8._0_8_;
                  }
                  local_3f8._M_dataplus._M_p = (pointer)&local_3f8.field_2;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)&local_3f8,"ecoOutput","");
                  dVar14 = ParameterReader::getVal(&this->paraRdr_,&local_3f8,0.0);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_3f8._M_dataplus._M_p != &local_3f8.field_2) {
                    operator_delete(local_3f8._M_dataplus._M_p);
                  }
                  *(uint *)((long)auStack_390 + *(long *)(local_3a8 + -0x18)) =
                       *(uint *)((long)auStack_390 + *(long *)(local_3a8 + -0x18)) & 0xfffffefb |
                       0x100;
                  *(undefined8 *)((long)&uStack_398 + *(long *)(local_3a8 + -0x18)) = 0x12;
                  *(undefined8 *)(local_3a0 + *(long *)(local_3a8 + -0x18)) = 8;
                  if ((dVar14 != 1.0) || (NAN(dVar14))) {
                    poVar6 = std::ostream::_M_insert<double>((double)local_418._0_8_);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"    ",4);
                    poVar6 = std::ostream::_M_insert<double>(stack0xfffffffffffffbf0);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"    ",4);
                    poVar6 = std::ostream::_M_insert<double>(local_420);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"    ",4);
                    poVar6 = std::ostream::_M_insert<double>(local_448);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"    ",4);
                    poVar6 = std::ostream::_M_insert<double>(local_458);
                    std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
                  }
                  else {
                    poVar6 = std::ostream::_M_insert<double>(local_448);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"    ",4);
                    poVar6 = std::ostream::_M_insert<double>(local_458);
                    std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
                  }
                  std::ostream::put((char)poVar6);
                  std::ostream::flush();
                  lVar9 = lVar9 + 1;
                  iVar7 = this->qnpts;
                  lVar8 = (long)iVar7;
                } while (lVar9 < lVar8);
              }
              lVar10 = lVar10 + 1;
            } while (lVar10 < lVar8);
          }
          lVar11 = lVar11 + 1;
        } while (lVar11 < iVar7);
      }
      std::ofstream::close();
      lVar12 = lVar12 + 1;
      local_3a8 = lVar4;
      *(undefined8 *)(local_3a0 + *(long *)(lVar4 + -0x18) + -8) = uVar5;
      std::filebuf::~filebuf(local_3a0);
      std::ios_base::~ios_base(local_2b0);
      std::__cxx11::ostringstream::~ostringstream(local_1a8);
      std::ios_base::~ios_base(local_138);
    } while (lVar12 < (long)this->n_KT + -1);
  }
  return;
}

Assistant:

void HBT_correlation::output_correlation_function() {
    for (int iK = 0; iK < n_KT - 1; iK++) {
        double npair_ratio =
            (static_cast<double>(number_of_pairs_numerator_KTdiff[iK])
             / static_cast<double>(number_of_pairs_denormenator_KTdiff[iK]));
        std::ostringstream filename;
        filename << path_ << "/HBT_correlation_function_KT_" << KT_array_[iK]
                 << "_" << KT_array_[iK + 1] << ".dat";
        std::ofstream output(filename.str().c_str());
        for (int iqlong = 0; iqlong < qnpts; iqlong++) {
            for (int iqout = 0; iqout < qnpts; iqout++) {
                for (int iqside = 0; iqside < qnpts; iqside++) {
                    int npart_num =
                        correl_3d_num_count[iK][iqout][iqside][iqlong];
                    int npart_denorm =
                        correl_3d_denorm[iK][iqout][iqside][iqlong];
                    double q_out_local, q_side_local, q_long_local;
                    double correl_fun_num, correl_fun_denorm;
                    if (npart_num < 2 || npart_denorm < 2) {
                        q_out_local = q_out[iqout];
                        q_side_local = q_side[iqside];
                        q_long_local = q_long[iqlong];
                        correl_fun_num = 0.0;
                        correl_fun_denorm = npart_denorm;
                    } else {
                        q_out_local =
                            (q_out_mean[iK][iqout][iqside][iqlong] / npart_num);
                        q_side_local =
                            (q_side_mean[iK][iqout][iqside][iqlong]
                             / npart_num);
                        q_long_local =
                            (q_long_mean[iK][iqout][iqside][iqlong]
                             / npart_num);

                        correl_fun_num =
                            (correl_3d_num[iK][iqout][iqside][iqlong]);
                        correl_fun_denorm =
                            (npair_ratio
                             * correl_3d_denorm[iK][iqout][iqside][iqlong]);
                    }

                    if (paraRdr_.getVal("ecoOutput", 0) == 1) {
                        output << std::scientific << std::setw(18)
                               << std::setprecision(8) << correl_fun_num
                               << "    " << correl_fun_denorm << std::endl;
                    } else {
                        output << std::scientific << std::setw(18)
                               << std::setprecision(8) << q_out_local << "    "
                               << q_side_local << "    " << q_long_local
                               << "    " << correl_fun_num << "    "
                               << correl_fun_denorm << std::endl;
                    }
                }
            }
        }
        output.close();
    }
}